

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O2

void __thiscall
CVmObjFrameRef::restore_from_file
          (CVmObjFrameRef *this,vm_obj_id_t self,CVmFile *fp,CVmObjFixup *fixups)

{
  char *pcVar1;
  int nlocals;
  int iVar2;
  vm_obj_id_t vVar3;
  uint uVar4;
  vm_frameref_ext *pvVar5;
  ulong uVar6;
  vm_val_t *val;
  char buf [5];
  
  nlocals = CVmFile::read_int2(fp);
  iVar2 = CVmFile::read_int2(fp);
  pvVar5 = alloc_ext(this,nlocals,iVar2);
  pcVar1 = (this->super_CVmObject).ext_;
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  CVmFile::read_bytes(fp,buf,5);
  CVmObjFixup::fix_dh(fixups,buf);
  vmb_get_dh(buf,&pvVar5->entry);
  CVmObjTable::request_post_load_init(&G_obj_table_X,self);
  CVmFile::read_bytes(fp,buf,5);
  CVmObjFixup::fix_dh(fixups,buf);
  vmb_get_dh(buf,&pvVar5->self);
  uVar6 = CVmFile::read_uint4(fp);
  vVar3 = (vm_obj_id_t)uVar6;
  pvVar5->defobj = vVar3;
  if (vVar3 != 0) {
    vVar3 = CVmObjFixup::get_new_id(fixups,vVar3);
    pvVar5->defobj = vVar3;
  }
  uVar6 = CVmFile::read_uint4(fp);
  vVar3 = (vm_obj_id_t)uVar6;
  pvVar5->targobj = vVar3;
  if (vVar3 != 0) {
    vVar3 = CVmObjFixup::get_new_id(fixups,vVar3);
    pvVar5->targobj = vVar3;
  }
  uVar4 = CVmFile::read_uint2(fp);
  pvVar5->targprop = (vm_prop_id_t)uVar4;
  CVmFile::read_bytes(fp,buf,5);
  CVmObjFixup::fix_dh(fixups,buf);
  vmb_get_dh(buf,&pvVar5->invokee);
  val = pvVar5->vars;
  for (iVar2 = iVar2 + nlocals; 0 < iVar2; iVar2 = iVar2 + -1) {
    CVmFile::read_bytes(fp,buf,5);
    CVmObjFixup::fix_dh(fixups,buf);
    vmb_get_dh(buf,val);
    val = val + 1;
  }
  return;
}

Assistant:

void CVmObjFrameRef::restore_from_file(VMG_ vm_obj_id_t self,
                                       class CVmFile *fp,
                                       class CVmObjFixup *fixups)
{
    char buf[VMB_DATAHOLDER];
    
    /* read the variables counts */
    int nlocals = fp->read_int2();
    int nparams = fp->read_int2();

    /* allocate the extension */
    vm_frameref_ext *ext = alloc_ext(vmg_ nlocals, nparams);

    /* 
     *   Since stack frames are inherently transient, a saved frame ref
     *   object can't point back to a live stack frame, so on restore we have
     *   to assume that our stack frame is inactive. 
     */
    get_ext()->fp = 0;

    /* load the entry pointer */
    fp->read_bytes(buf, VMB_DATAHOLDER);
    fixups->fix_dh(vmg_ buf);
    vmb_get_dh(buf, &ext->entry);

    /* after other objects are loaded, resolve the entry pointer */
    G_obj_table->request_post_load_init(self);

    /* restore the method context values */
    fp->read_bytes(buf, VMB_DATAHOLDER);
    fixups->fix_dh(vmg_ buf);
    vmb_get_dh(buf, &ext->self);

    ext->defobj = (vm_obj_id_t)fp->read_uint4();
    if (ext->defobj != VM_INVALID_OBJ)
        ext->defobj = fixups->get_new_id(vmg_ ext->defobj);
    
    ext->targobj = (vm_obj_id_t)fp->read_uint4();
    if (ext->targobj != VM_INVALID_OBJ)
        ext->targobj = fixups->get_new_id(vmg_ ext->targobj);
    
    ext->targprop = (vm_prop_id_t)fp->read_uint2();

    fp->read_bytes(buf, VMB_DATAHOLDER);
    fixups->fix_dh(vmg_ buf);
    vmb_get_dh(buf, &ext->invokee);

    /* load the snapshot values */
    int i;
    vm_val_t *v;
    for (i = nlocals + nparams, v = ext->vars ; i > 0 ; --i, ++v)
    {
        fp->read_bytes(buf, VMB_DATAHOLDER);
        fixups->fix_dh(vmg_ buf);
        vmb_get_dh(buf, v);
    }
}